

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func.h
# Opt level: O1

bool __thiscall GF2::VSubst<8UL>::Next(VSubst<8UL> *this)

{
  WW<8UL> *pWVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  word wVar9;
  word wVar10;
  
  lVar3 = 0xfe;
  do {
    if ((this->super_VFunc<8UL,_8UL>).super_Func<8UL,_GF2::WW<8UL>_>._vals[lVar3]._words[0] <=
        (this->super_VFunc<8UL,_8UL>).super_Func<8UL,_GF2::WW<8UL>_>._vals[lVar3 + 1]._words[0])
    goto LAB_0012b765;
    bVar8 = lVar3 != 0;
    lVar3 = lVar3 + -1;
  } while (bVar8);
  lVar3 = -1;
LAB_0012b765:
  lVar4 = lVar3;
  if (lVar3 == -1) {
    wVar9 = 0;
    wVar10 = 1;
    lVar4 = 0;
    do {
      pWVar1 = (this->super_VFunc<8UL,_8UL>).super_Func<8UL,_GF2::WW<8UL>_>._vals + lVar4;
      pWVar1->_words[0] = wVar9;
      pWVar1[1]._words[0] = wVar10;
      lVar4 = lVar4 + 2;
      wVar9 = wVar9 + 2;
      wVar10 = wVar10 + 2;
    } while (lVar4 != 0x100);
  }
  else {
    do {
      if (lVar4 == 0xfe) {
        lVar4 = 0xff;
        break;
      }
      lVar2 = lVar4 + 2;
      lVar4 = lVar4 + 1;
    } while ((this->super_VFunc<8UL,_8UL>).super_Func<8UL,_GF2::WW<8UL>_>._vals[lVar3]._words[0] <
             (this->super_VFunc<8UL,_8UL>).super_Func<8UL,_GF2::WW<8UL>_>._vals[lVar2]._words[0]);
    if (lVar3 != lVar4) {
      uVar5 = (this->super_VFunc<8UL,_8UL>).super_Func<8UL,_GF2::WW<8UL>_>._vals[lVar3]._words[0] ^
              (this->super_VFunc<8UL,_8UL>).super_Func<8UL,_GF2::WW<8UL>_>._vals[lVar4]._words[0];
      (this->super_VFunc<8UL,_8UL>).super_Func<8UL,_GF2::WW<8UL>_>._vals[lVar3]._words[0] = uVar5;
      uVar5 = uVar5 ^ (this->super_VFunc<8UL,_8UL>).super_Func<8UL,_GF2::WW<8UL>_>._vals[lVar4].
                      _words[0];
      (this->super_VFunc<8UL,_8UL>).super_Func<8UL,_GF2::WW<8UL>_>._vals[lVar4]._words[0] = uVar5;
      pWVar1 = (this->super_VFunc<8UL,_8UL>).super_Func<8UL,_GF2::WW<8UL>_>._vals + lVar3;
      pWVar1->_words[0] = pWVar1->_words[0] ^ uVar5;
    }
    if (lVar3 + 1U < 0xff) {
      uVar6 = 0xff;
      uVar5 = lVar3 + 2;
      do {
        uVar7 = (this->super_VFunc<8UL,_8UL>).super_Func<8UL,_GF2::WW<8UL>_>._vals[uVar5 - 1]._words
                [0] ^ (this->super_VFunc<8UL,_8UL>).super_Func<8UL,_GF2::WW<8UL>_>._vals[uVar6].
                      _words[0];
        (this->super_VFunc<8UL,_8UL>).super_Func<8UL,_GF2::WW<8UL>_>._vals[uVar5 - 1]._words[0] =
             uVar7;
        uVar7 = uVar7 ^ (this->super_VFunc<8UL,_8UL>).super_Func<8UL,_GF2::WW<8UL>_>._vals[uVar6].
                        _words[0];
        (this->super_VFunc<8UL,_8UL>).super_Func<8UL,_GF2::WW<8UL>_>._vals[uVar6]._words[0] = uVar7;
        pWVar1 = (this->super_VFunc<8UL,_8UL>).super_Func<8UL,_GF2::WW<8UL>_>._vals + (uVar5 - 1);
        pWVar1->_words[0] = pWVar1->_words[0] ^ uVar7;
        uVar6 = uVar6 - 1;
        bVar8 = uVar5 < uVar6;
        uVar5 = uVar5 + 1;
      } while (bVar8);
    }
  }
  return lVar3 != -1;
}

Assistant:

bool Next()
	{
		// ищем с конца убывающую цепочку
		word i = _size - 2;
		while (i != WORD_MAX && Get(i) > Get(i + 1)) i--;
		// достигли начала, т.е. последняя подстановка?
		if (i == WORD_MAX)
		{
			First();
			return false;
		}
		// здесь s[i] < s[i + 1] > .... > s[_size - 1]
		word j = i + 1;
		while (j + 1 < _size && Get(j + 1) > Get(i)) j++;
		// теперь s[i] < s[j] и s[i] > s[j + 1]
		// выполняем транспозиции
		Transpose(i, j);
		j = _size;
		while (++i < --j)
			Transpose(i, j);
		// не последняя подстановка 
		return true;
	}